

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QRectF *r)

{
  long lVar1;
  QRectF *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  double h;
  double w;
  double y;
  double x;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(in_RDI,&in_RSI->xp);
  QDataStream::operator>>(in_RDI,&in_RSI->xp);
  QDataStream::operator>>(in_RDI,&in_RSI->xp);
  QDataStream::operator>>(in_RDI,&in_RSI->xp);
  QRectF::setRect(in_RSI,-NAN,-NAN,-NAN,-NAN);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QRectF &r)
{
    double x, y, w, h;
    s >> x;
    s >> y;
    s >> w;
    s >> h;
    r.setRect(qreal(x), qreal(y), qreal(w), qreal(h));
    return s;
}